

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedDirectory.cpp
# Opt level: O2

void __thiscall SharedDirectory::on_finished_writing(SharedDirectory *this,string *name)

{
  ulong uVar1;
  bool bVar2;
  iterator __position;
  Error *pEVar3;
  uint64_t size;
  path p;
  uintmax_t local_68;
  path local_60;
  string local_40;
  
  __position = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               ::find(&(this->pending_files)._M_t,name);
  if ((_Rb_tree_header *)__position._M_node ==
      &(this->pending_files)._M_t._M_impl.super__Rb_tree_header) {
    pEVar3 = (Error *)__cxa_allocate_exception(0x3f0);
    Error::Error(pEVar3,"Not registered file");
    __cxa_throw(pEVar3,&Error::typeinfo,std::exception::~exception);
  }
  uVar1 = *(ulong *)(__position._M_node + 2);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
  ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                      *)&this->pending_files,__position);
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  path_in_dir(&local_60,this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  bVar2 = boost::filesystem::exists(&local_60);
  if (bVar2) {
    local_68 = boost::filesystem::file_size(&local_60);
    if (uVar1 < local_68) {
      boost::filesystem::remove((char *)&local_60);
      this->remaining_space = this->remaining_space + uVar1;
    }
    else {
      this->remaining_space = this->remaining_space + (uVar1 - local_68);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
      ::_M_emplace_unique<std::__cxx11::string&,unsigned_long&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                  *)this,name,&local_68);
    }
    std::__cxx11::string::~string((string *)&local_60);
    return;
  }
  pEVar3 = (Error *)__cxa_allocate_exception(0x3f0);
  Error::Error(pEVar3,"File not exists");
  __cxa_throw(pEVar3,&Error::typeinfo,std::exception::~exception);
}

Assistant:

void SharedDirectory::on_finished_writing(std::string name) {
  auto it = pending_files.find(name);
  if (it == pending_files.end()) {
    throw Error("Not registered file");
  }
  uint64_t promised_size = it->second;
  pending_files.erase(it);
  path p = path_in_dir(name);
  if (!exists(p)) {
    throw Error("File not exists");
  }
  uint64_t size = file_size(p);
  if (size > promised_size) {
    remove(p);
    remaining_space += promised_size;
  } else {
    remaining_space += promised_size - size;
    indexed_files.emplace(name, size);
  }
}